

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlReadDoc(xmlChar *cur,char *URL,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlChar *cur_local;
  
  if (cur == (xmlChar *)0x0) {
    cur_local = (xmlChar *)0x0;
  }
  else {
    xmlInitParser();
    ctxt_00 = xmlCreateDocParserCtxt(cur);
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      cur_local = (xmlChar *)0x0;
    }
    else {
      cur_local = (xmlChar *)xmlDoRead(ctxt_00,URL,encoding,options,0);
    }
  }
  return (xmlDocPtr)cur_local;
}

Assistant:

xmlDocPtr
xmlReadDoc(const xmlChar * cur, const char *URL, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;

    if (cur == NULL)
        return (NULL);
    xmlInitParser();

    ctxt = xmlCreateDocParserCtxt(cur);
    if (ctxt == NULL)
        return (NULL);
    return (xmlDoRead(ctxt, URL, encoding, options, 0));
}